

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O0

void __thiscall tt::Thread::setDefaultName(Thread *this)

{
  uint uVar1;
  char local_38 [8];
  char buf [32];
  Thread *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    snprintf(local_38,0x20,"Thread");
    std::__cxx11::string::operator=((string *)&this->m_name,local_38);
  }
  return;
}

Assistant:

void Thread::setDefaultName(){
	if(m_name.empty()){
		char buf[32];

		snprintf(buf,sizeof(buf),"Thread");

		m_name = buf;
	}
}